

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_random_unit.cpp
# Opt level: O2

Roaring64Map * make_random_bitset64(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  fd_set *__writefds;
  char *__filename;
  ulong uVar8;
  Roaring64Map *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  uint64_t element;
  
  doublechecked::Roaring64Map::Roaring64Map(in_RDI);
  iVar4 = rand();
  __writefds = (fd_set *)0x64;
  uVar8 = (long)iVar4 % 100 & 0xffffffff;
  if ((int)((long)iVar4 % 100) < 1) {
    uVar8 = 0;
  }
  while (iVar4 = (int)uVar8, uVar8 = (ulong)(iVar4 - 1), iVar4 != 0) {
    iVar4 = rand();
    uVar7 = gravity64;
    switch((long)iVar4 % 5 & 0xffffffff) {
    case 0:
      doublechecked::Roaring64Map::add(in_RDI,gravity64);
      break;
    case 1:
      iVar4 = rand();
      iVar6 = rand();
      doublechecked::Roaring64Map::addRange
                (in_RDI,(uVar7 + (long)(iVar4 % 0x32)) - 0x19,
                 ((long)(iVar6 % 100) + uVar7 + (long)(iVar4 % 0x32)) - 0x19);
      break;
    case 2:
      iVar4 = rand();
      iVar6 = rand();
      doublechecked::Roaring64Map::removeRange
                (in_RDI,(uVar7 + (long)(iVar4 % 10)) - 5,
                 ((long)(iVar6 % 5) + uVar7 + (long)(iVar4 % 10)) - 5);
      break;
    case 3:
      iVar4 = rand();
      iVar6 = rand();
      doublechecked::Roaring64Map::flip
                (in_RDI,(uVar7 + (long)(iVar4 % 0x32)) - 0x19,
                 ((long)(iVar6 % 0x32) + uVar7 + (long)(iVar4 % 0x32)) - 0x19);
      break;
    case 4:
      uVar7 = doublechecked::Roaring64Map::cardinality(in_RDI);
      if (uVar7 != 0) {
        iVar4 = rand();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar7;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)iVar4;
        __filename = SUB168(auVar2 % auVar1,0);
        element = 0;
        uVar5 = doublechecked::Roaring64Map::select
                          (in_RDI,SUB164(auVar2 % auVar1,0),(fd_set *)&element,__writefds,in_R8,
                           in_R9);
        _assert_true((ulong)(uVar5 & 0xff),"r.select(rnk, &element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                     ,0x8a);
        uVar7 = doublechecked::Roaring64Map::rank(in_RDI,element);
        _assert_int_equal((unsigned_long)(__filename + 1),uVar7,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                          ,0x8b);
        doublechecked::Roaring64Map::remove(in_RDI,__filename);
      }
      break;
    default:
      _assert_true(0,"false",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                   ,0x92);
    }
    iVar4 = rand();
    __writefds = (fd_set *)gravity64;
    gravity64 = ((long)(iVar4 % 200) + gravity64) - 100;
  }
  bVar3 = doublechecked::Roaring64Map::does_std_set_match_roaring(in_RDI);
  _assert_true((ulong)bVar3,"r.does_std_set_match_roaring()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
               ,0x96);
  return in_RDI;
}

Assistant:

Roaring64Map make_random_bitset64() {
    Roaring64Map r;
    int num_ops = rand() % 100;
    for (int i = 0; i < num_ops; ++i) {
        switch (rand() % 5) {
            case 0:
                r.add(gravity64);
                break;

            case 1: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.addRange(start, start + rand() % 100);
                break;
            }

            case 2: {
                uint64_t start = gravity64 + (rand() % 10) - 5;
                r.removeRange(start, start + rand() % 5);
                break;
            }

            case 3: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.flip(start, start + rand() % 50);
                break;
            }

            case 4: {  // tests remove(), select(), rank()
                uint64_t card = r.cardinality();
                if (card != 0) {
                    uint64_t rnk = rand() % card;
                    uint64_t element = 0;
                    assert_true(r.select(rnk, &element));
                    assert_int_equal(rnk + 1, r.rank(element));
                    r.remove(rnk);
                }
                break;
            }

            default:
                assert_true(false);
        }
        gravity64 += (rand() % 200) - 100;
    }
    assert_true(r.does_std_set_match_roaring());
    return r;
}